

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pace.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  undefined4 extraout_var;
  long *plVar6;
  undefined8 *puVar7;
  size_type *psVar8;
  long *plVar9;
  char *pcVar10;
  int i;
  ulong uVar11;
  ListGraph g;
  string input_file_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  string local_4c0;
  undefined1 local_4a0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  ListGraph local_478;
  string local_448;
  string local_428;
  string local_408;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  undefined1 local_388 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_378;
  PierceRating local_368;
  ulong local_360;
  string local_358;
  ArrayIDIDFunc local_338;
  ArrayIDIDFunc local_320;
  ArrayIDIDFunc local_308;
  ArrayIDIDFunc local_2f0;
  ArrayIDIDFunc local_2d8;
  ArrayIDIDFunc local_2c0;
  ArrayIDIDFunc local_2a8;
  ArrayIDIDFunc local_290;
  ArrayIDIDFunc local_278;
  ArrayIDIDFunc local_260;
  ArrayIDIDFunc local_248;
  ArrayIDIDFunc local_230;
  ArrayIDIDFunc local_218;
  ArrayIDIDFunc local_200;
  ArrayIDIDFunc local_1e8;
  ArrayIDIDFunc local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  ArrayIDIDFunc local_f8;
  ArrayIDIDFunc local_e0;
  ArrayIDIDFunc local_c8;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  signal(0xf,signal_handler);
  signal(2,signal_handler);
  signal(0xb,signal_handler);
  local_388._0_8_ = &aStack_378;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"-","");
  bVar1 = 1 < argc;
  if (argc < 2) {
    local_360 = 0;
    iVar3 = 0;
  }
  else {
    pcVar10 = argv[1];
    iVar3 = strcmp(pcVar10,"--help");
    if (iVar3 == 0) {
      local_360 = 0;
    }
    else {
      iVar3 = 1;
      local_360 = 0;
      do {
        iVar4 = strcmp(pcVar10,"-h");
        if (iVar4 == 0) break;
        iVar4 = strcmp(pcVar10,"--verbose");
        if (iVar4 == 0) {
          print_verbose_status = true;
          print_status = true;
        }
        else {
          iVar4 = strcmp(pcVar10,"--status");
          if (iVar4 == 0) {
            print_status = true;
          }
          else {
            iVar4 = strcmp(pcVar10,"-i");
            uVar2 = local_388._8_8_;
            if (iVar3 == argc + -1 || iVar4 != 0) {
              iVar4 = strcmp(pcVar10,"-s");
              if (iVar4 == 0 && iVar3 != argc + -1) {
                lVar5 = (long)iVar3;
                iVar3 = iVar3 + 1;
                iVar4 = atoi(argv[lVar5 + 1]);
                local_360 = CONCAT44(extraout_var,iVar4);
              }
            }
            else {
              pcVar10 = argv[(long)iVar3 + 1];
              strlen(pcVar10);
              std::__cxx11::string::_M_replace((ulong)local_388,0,(char *)uVar2,(ulong)pcVar10);
              iVar3 = iVar3 + 1;
            }
          }
        }
        iVar3 = iVar3 + 1;
        bVar1 = iVar3 < argc;
        if (argc <= iVar3) {
          iVar3 = 0;
          goto LAB_00116685;
        }
        pcVar10 = argv[iVar3];
        iVar4 = strcmp(pcVar10,"--help");
      } while (iVar4 != 0);
    }
    iVar3 = 1;
    write(2,
          "Computes a tree depth decomposition given a graph. The graph is read by default from stdin in the PACE 2020 graph format. The output is written to stdout. Status messages can be written to stderr, if requested. By default, nothing is written to stderr. The program supports the following options:\n  -h,--help Print this message and do nothing else\n  --status  Print a message to stderr each time a\n            better tree depth decomposition is found\n  --verbose Print a message to stderr each time a tree\n            depth decomposition was computed independent\n            of whether it is better than the best one \n            found so far\n  -i <file> Instead of reading the graph from stdin,\n            read it from <file>\n  -s <seed> Use <seed> as seed for the random number\n            generator. This must be an integer. The\n            default seed is 0.\n"
          ,0x360);
  }
LAB_00116685:
  if (!bVar1) {
    load_uncached_text_file<ListGraph(std::istream&)>
              (&local_478,(string *)local_388,load_pace_graph_impl);
    if (tail.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
      operator_delete__(tail.super_ArrayIDFunc<int>.data_);
    }
    tail.super_ArrayIDFunc<int>.preimage_count_ =
         local_478.tail.super_ArrayIDFunc<int>.preimage_count_;
    local_478.tail.super_ArrayIDFunc<int>._0_8_ =
         local_478.tail.super_ArrayIDFunc<int>._0_8_ & 0xffffffff00000000;
    tail.super_ArrayIDFunc<int>.data_ = local_478.tail.super_ArrayIDFunc<int>.data_;
    local_478.tail.super_ArrayIDFunc<int>.data_ = (int *)0x0;
    tail.image_count_ = local_478.tail.image_count_;
    if (head.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
      operator_delete__(head.super_ArrayIDFunc<int>.data_);
    }
    head.super_ArrayIDFunc<int>.preimage_count_ =
         local_478.head.super_ArrayIDFunc<int>.preimage_count_;
    local_478.head.super_ArrayIDFunc<int>._0_8_ =
         local_478.head.super_ArrayIDFunc<int>._0_8_ & 0xffffffff00000000;
    head.super_ArrayIDFunc<int>.data_ = local_478.head.super_ArrayIDFunc<int>.data_;
    local_478.head.super_ArrayIDFunc<int>.data_ = (int *)0x0;
    head.image_count_ = local_478.head.image_count_;
    if (local_478.tail.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
      operator_delete__(local_478.tail.super_ArrayIDFunc<int>.data_);
    }
    if (local_478.head.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
      operator_delete__(local_478.head.super_ArrayIDFunc<int>.data_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._0_8_ != &aStack_378) {
      operator_delete((void *)local_388._0_8_);
    }
    if (print_status == true) {
      std::__cxx11::to_string(&local_4c0,tail.image_count_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_4a0 + 8),"node_count = ",&local_4c0);
      plVar6 = (long *)std::__cxx11::string::append(local_4a0 + 8);
      local_4e0._M_dataplus._M_p = (pointer)*plVar6;
      psVar8 = (size_type *)(plVar6 + 2);
      if ((size_type *)local_4e0._M_dataplus._M_p == psVar8) {
        local_4e0.field_2._M_allocated_capacity = *psVar8;
        local_4e0.field_2._8_8_ = plVar6[3];
        local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
      }
      else {
        local_4e0.field_2._M_allocated_capacity = *psVar8;
      }
      local_4e0._M_string_length = plVar6[1];
      *plVar6 = (long)psVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::to_string(&local_3e8,tail.super_ArrayIDFunc<int>.preimage_count_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_388,
                     &local_4e0,&local_3e8);
      plVar6 = (long *)std::__cxx11::string::append(local_388);
      puVar7 = (undefined8 *)&local_478.head.image_count_;
      local_478.head.super_ArrayIDFunc<int>._0_8_ = *plVar6;
      plVar9 = plVar6 + 2;
      if ((long *)local_478.head.super_ArrayIDFunc<int>._0_8_ == plVar9) {
        local_478.head._16_8_ = *plVar9;
        local_478.tail.super_ArrayIDFunc<int>._0_8_ = plVar6[3];
        local_478.head.super_ArrayIDFunc<int>._0_8_ = puVar7;
      }
      else {
        local_478.head._16_8_ = *plVar9;
      }
      local_478.head.super_ArrayIDFunc<int>.data_ = (int *)plVar6[1];
      *plVar6 = (long)plVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388._0_8_ != &aStack_378) {
        operator_delete((void *)local_388._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
        operator_delete(local_3e8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
        operator_delete(local_4e0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498._M_dataplus._M_p != &local_498.field_2) {
        operator_delete(local_498._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
        operator_delete(local_4c0._M_dataplus._M_p);
      }
      write(2,(void *)local_478.head.super_ArrayIDFunc<int>._0_8_,
            (size_t)local_478.head.super_ArrayIDFunc<int>.data_);
      if ((undefined8 *)local_478.head.super_ArrayIDFunc<int>._0_8_ != puVar7) {
        operator_delete((void *)local_478.head.super_ArrayIDFunc<int>._0_8_);
      }
    }
    if (print_status == true) {
      gettimeofday((timeval *)&local_478,(__timezone_ptr_t)0x0);
      program_start_milli_time =
           (ulong)local_478.head.super_ArrayIDFunc<int>.data_ / 1000 +
           local_478.head.super_ArrayIDFunc<int>._0_8_ * 1000;
    }
    iVar3 = tail.image_count_;
    local_4a0 = (undefined1  [8])
                ((ulong)(long)(int)local_360 % 0x7fffffff +
                (ulong)((ulong)(long)(int)local_360 % 0x7fffffff == 0));
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"greedy order","");
    compute_greedy_order(&local_478.head,&tail,&head);
    test_new_elimination_order(&local_90,&local_478.head);
    if (local_478.head.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
      operator_delete__(local_478.head.super_ArrayIDFunc<int>.data_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if (iVar3 < best_tree_depth * 0x14) {
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"refined bfs split in nested dissection","");
      ArrayIDFunc<int>::ArrayIDFunc(&local_1d0.super_ArrayIDFunc<int>,&tail.super_ArrayIDFunc<int>);
      local_1d0.image_count_ = tail.image_count_;
      ArrayIDFunc<int>::ArrayIDFunc(&local_c8.super_ArrayIDFunc<int>,&head.super_ArrayIDFunc<int>);
      local_c8.image_count_ = head.image_count_;
      local_388._0_8_ = local_4a0;
      compute_tree_depth_order<main::__0>
                (&local_478.head,&local_1d0,&local_c8,(anon_class_8_1_f6d195b4 *)local_388,
                 best_tree_depth + -1);
      test_new_elimination_order(&local_b0,&local_478.head);
      if (local_478.head.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
        operator_delete__(local_478.head.super_ArrayIDFunc<int>.data_);
      }
      if (local_c8.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
        operator_delete__(local_c8.super_ArrayIDFunc<int>.data_);
      }
      if (local_1d0.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
        operator_delete__(local_1d0.super_ArrayIDFunc<int>.data_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
    }
    local_478.head._16_8_ = 0;
    local_478.tail.super_ArrayIDFunc<int>.preimage_count_ = 0;
    local_478.tail.super_ArrayIDFunc<int>._4_4_ = 0;
    local_4a0 = (undefined1  [8])((ulong)((long)local_4a0 * 0xbc8f) % 0x7fffffff);
    local_478.head.super_ArrayIDFunc<int>._0_8_ = (long)local_4a0 << 0x20;
    local_478.tail.super_ArrayIDFunc<int>.data_ =
         (int *)((ulong)local_478.tail.super_ArrayIDFunc<int>.data_ & 0xffffffff00000000);
    local_478.head.super_ArrayIDFunc<int>.data_ = (int *)CONCAT44(0x3e4ccccd,iVar3);
    local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_4a0 + 8),"random_seed","");
    flow_cutter::Config::get(&local_4e0,(Config *)&local_478,(string *)(local_4a0 + 8));
    std::operator+(&local_50,
                   "edge flowcutter cutter_count=1 distant-source-target pierce_rating=max_target_minus_source_hop_dist random_seed="
                   ,&local_4e0);
    ArrayIDFunc<int>::ArrayIDFunc(&local_1e8.super_ArrayIDFunc<int>,&tail.super_ArrayIDFunc<int>);
    local_1e8.image_count_ = tail.image_count_;
    ArrayIDFunc<int>::ArrayIDFunc(&local_e0.super_ArrayIDFunc<int>,&head.super_ArrayIDFunc<int>);
    local_e0.image_count_ = head.image_count_;
    local_368 = (PierceRating)local_478.tail.super_ArrayIDFunc<int>.data_;
    local_388._0_8_ = local_478.head.super_ArrayIDFunc<int>._0_8_;
    local_388._8_8_ = local_478.head.super_ArrayIDFunc<int>.data_;
    aStack_378._M_allocated_capacity = local_478.head._16_8_;
    aStack_378._8_8_ = local_478.tail.super_ArrayIDFunc<int>._0_8_;
    compute_tree_depth_order<flow_cutter::FastComputeSeparator>
              ((ArrayIDIDFunc *)&local_4c0,&local_1e8,&local_e0,(FastComputeSeparator *)local_388,
               best_tree_depth + -1);
    test_new_elimination_order(&local_50,(ArrayIDIDFunc *)&local_4c0);
    if ((void *)local_4c0._M_string_length != (void *)0x0) {
      operator_delete__((void *)local_4c0._M_string_length);
    }
    if (local_e0.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
      operator_delete__(local_e0.super_ArrayIDFunc<int>.data_);
    }
    if (local_1e8.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
      operator_delete__(local_1e8.super_ArrayIDFunc<int>.data_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
      operator_delete(local_4e0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_498._M_dataplus._M_p != &local_498.field_2) {
      operator_delete(local_498._M_dataplus._M_p);
    }
    local_478.head._16_8_ = 0;
    local_478.tail.super_ArrayIDFunc<int>.preimage_count_ = 0;
    local_478.tail.super_ArrayIDFunc<int>._4_4_ = 0;
    local_4a0 = (undefined1  [8])((ulong)((long)local_4a0 * 0xbc8f) % 0x7fffffff);
    local_478.head.super_ArrayIDFunc<int>._0_8_ = (long)local_4a0 << 0x20;
    local_478.tail.super_ArrayIDFunc<int>.data_ =
         (int *)((ulong)local_478.tail.super_ArrayIDFunc<int>.data_ & 0xffffffff00000000);
    local_478.head.super_ArrayIDFunc<int>.data_ = (int *)CONCAT44(0x3e4ccccd,iVar3);
    local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_4a0 + 8),"random_seed","");
    flow_cutter::Config::get(&local_4e0,(Config *)&local_478,(string *)(local_4a0 + 8));
    std::operator+(&local_70,
                   "flowcutter cutter_count=1 distant-source-target pierce_rating=max_target_minus_source_hop_dist random_seed="
                   ,&local_4e0);
    ArrayIDFunc<int>::ArrayIDFunc(&local_200.super_ArrayIDFunc<int>,&tail.super_ArrayIDFunc<int>);
    local_200.image_count_ = tail.image_count_;
    ArrayIDFunc<int>::ArrayIDFunc(&local_f8.super_ArrayIDFunc<int>,&head.super_ArrayIDFunc<int>);
    local_f8.image_count_ = head.image_count_;
    local_368 = (PierceRating)local_478.tail.super_ArrayIDFunc<int>.data_;
    local_388._0_8_ = local_478.head.super_ArrayIDFunc<int>._0_8_;
    local_388._8_8_ = local_478.head.super_ArrayIDFunc<int>.data_;
    aStack_378._M_allocated_capacity = local_478.head._16_8_;
    aStack_378._8_8_ = local_478.tail.super_ArrayIDFunc<int>._0_8_;
    compute_tree_depth_order<flow_cutter::ComputeSeparator>
              ((ArrayIDIDFunc *)&local_4c0,&local_200,&local_f8,(ComputeSeparator *)local_388,
               best_tree_depth + -1);
    test_new_elimination_order(&local_70,(ArrayIDIDFunc *)&local_4c0);
    if ((void *)local_4c0._M_string_length != (void *)0x0) {
      operator_delete__((void *)local_4c0._M_string_length);
    }
    if (local_f8.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
      operator_delete__(local_f8.super_ArrayIDFunc<int>.data_);
    }
    if (local_200.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
      operator_delete__(local_200.super_ArrayIDFunc<int>.data_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
      operator_delete(local_4e0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_498._M_dataplus._M_p != &local_498.field_2) {
      operator_delete(local_498._M_dataplus._M_p);
    }
    local_478.head._16_8_ = 0;
    local_478.tail.super_ArrayIDFunc<int>.preimage_count_ = 0;
    local_478.tail.super_ArrayIDFunc<int>._4_4_ = 0;
    local_478.tail.super_ArrayIDFunc<int>.data_ =
         (int *)((ulong)local_478.tail.super_ArrayIDFunc<int>.data_ & 0xffffffff00000000);
    local_478.head.super_ArrayIDFunc<int>.data_ = (int *)CONCAT44(0x3e4ccccd,iVar3);
    local_360 = local_360 & 0xffffffff00000000;
    uVar11 = 0;
    do {
      if ((uVar11 & 1) == 0) {
        local_478.tail.super_ArrayIDFunc<int>.data_ =
             (int *)((ulong)local_478.tail.super_ArrayIDFunc<int>.data_._4_4_ << 0x20);
      }
      else {
        local_478.tail.super_ArrayIDFunc<int>.data_ =
             (int *)CONCAT44(local_478.tail.super_ArrayIDFunc<int>.data_._4_4_,3);
      }
      local_4a0 = (undefined1  [8])((ulong)((long)local_4a0 * 0xbc8f) % 0x7fffffff);
      local_478.head.super_ArrayIDFunc<int>._4_4_ = SUB84(local_4a0,0);
      local_478.head.super_ArrayIDFunc<int>.preimage_count_ = 1;
      local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"cutter_count","");
      flow_cutter::Config::get(&local_3a8,(Config *)&local_478,&local_408);
      std::operator+(&local_3e8,"flowcutter cutter_count=",&local_3a8);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_3e8);
      local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
      psVar8 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_4c0.field_2._M_allocated_capacity = *psVar8;
        local_4c0.field_2._8_8_ = plVar6[3];
      }
      else {
        local_4c0.field_2._M_allocated_capacity = *psVar8;
        local_4c0._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_4c0._M_string_length = plVar6[1];
      *plVar6 = (long)psVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"pierce_rating","");
      flow_cutter::Config::get(&local_3c8,(Config *)&local_478,&local_428);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_4a0 + 8),&local_4c0,&local_3c8);
      plVar6 = (long *)std::__cxx11::string::append(local_4a0 + 8);
      local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
      psVar8 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_4e0.field_2._M_allocated_capacity = *psVar8;
        local_4e0.field_2._8_8_ = plVar6[3];
      }
      else {
        local_4e0.field_2._M_allocated_capacity = *psVar8;
        local_4e0._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_4e0._M_string_length = plVar6[1];
      *plVar6 = (long)psVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"random_seed","");
      flow_cutter::Config::get(&local_358,(Config *)&local_478,&local_448);
      std::operator+(&local_118,&local_4e0,&local_358);
      ArrayIDFunc<int>::ArrayIDFunc(&local_218.super_ArrayIDFunc<int>,&tail.super_ArrayIDFunc<int>);
      local_218.image_count_ = tail.image_count_;
      ArrayIDFunc<int>::ArrayIDFunc(&local_230.super_ArrayIDFunc<int>,&head.super_ArrayIDFunc<int>);
      local_230.image_count_ = head.image_count_;
      local_368 = (PierceRating)local_478.tail.super_ArrayIDFunc<int>.data_;
      local_388._0_8_ = local_478.head.super_ArrayIDFunc<int>._0_8_;
      local_388._8_8_ = local_478.head.super_ArrayIDFunc<int>.data_;
      aStack_378._M_allocated_capacity = local_478.head._16_8_;
      aStack_378._8_8_ = local_478.tail.super_ArrayIDFunc<int>._0_8_;
      compute_tree_depth_order<flow_cutter::ComputeSeparator>
                (&local_338,&local_218,&local_230,(ComputeSeparator *)local_388,best_tree_depth + -1
                );
      test_new_elimination_order(&local_118,&local_338);
      if (local_338.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
        operator_delete__(local_338.super_ArrayIDFunc<int>.data_);
      }
      if (local_230.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
        operator_delete__(local_230.super_ArrayIDFunc<int>.data_);
      }
      if (local_218.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
        operator_delete__(local_218.super_ArrayIDFunc<int>.data_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_358._M_dataplus._M_p != &local_358.field_2) {
        operator_delete(local_358._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_448._M_dataplus._M_p != &local_448.field_2) {
        operator_delete(local_448._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
        operator_delete(local_4e0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498._M_dataplus._M_p != &local_498.field_2) {
        operator_delete(local_498._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
        operator_delete(local_3c8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_428._M_dataplus._M_p != &local_428.field_2) {
        operator_delete(local_428._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
        operator_delete(local_4c0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
        operator_delete(local_3e8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
        operator_delete(local_3a8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_408._M_dataplus._M_p != &local_408.field_2) {
        operator_delete(local_408._M_dataplus._M_p);
      }
      local_4a0 = (undefined1  [8])((ulong)((long)local_4a0 * 0xbc8f) % 0x7fffffff);
      local_478.head.super_ArrayIDFunc<int>._4_4_ = SUB84(local_4a0,0);
      local_478.head.super_ArrayIDFunc<int>.preimage_count_ = 2;
      local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"cutter_count","");
      flow_cutter::Config::get(&local_3a8,(Config *)&local_478,&local_408);
      std::operator+(&local_3e8,"flowcutter cutter_count=",&local_3a8);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_3e8);
      local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
      psVar8 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_4c0.field_2._M_allocated_capacity = *psVar8;
        local_4c0.field_2._8_8_ = plVar6[3];
      }
      else {
        local_4c0.field_2._M_allocated_capacity = *psVar8;
        local_4c0._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_4c0._M_string_length = plVar6[1];
      *plVar6 = (long)psVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"pierce_rating","");
      flow_cutter::Config::get(&local_3c8,(Config *)&local_478,&local_428);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_4a0 + 8),&local_4c0,&local_3c8);
      puVar7 = (undefined8 *)std::__cxx11::string::append(local_4a0 + 8);
      local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
      psVar8 = puVar7 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_4e0.field_2._M_allocated_capacity = *psVar8;
        local_4e0.field_2._8_8_ = puVar7[3];
      }
      else {
        local_4e0.field_2._M_allocated_capacity = *psVar8;
        local_4e0._M_dataplus._M_p = (pointer)*puVar7;
      }
      local_4e0._M_string_length = puVar7[1];
      *puVar7 = psVar8;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"random_seed","");
      flow_cutter::Config::get(&local_358,(Config *)&local_478,&local_448);
      std::operator+(&local_138,&local_4e0,&local_358);
      ArrayIDFunc<int>::ArrayIDFunc(&local_248.super_ArrayIDFunc<int>,&tail.super_ArrayIDFunc<int>);
      local_248.image_count_ = tail.image_count_;
      ArrayIDFunc<int>::ArrayIDFunc(&local_260.super_ArrayIDFunc<int>,&head.super_ArrayIDFunc<int>);
      local_260.image_count_ = head.image_count_;
      local_368 = (PierceRating)local_478.tail.super_ArrayIDFunc<int>.data_;
      local_388._0_8_ = local_478.head.super_ArrayIDFunc<int>._0_8_;
      local_388._8_8_ = local_478.head.super_ArrayIDFunc<int>.data_;
      aStack_378._M_allocated_capacity = local_478.head._16_8_;
      aStack_378._8_8_ = local_478.tail.super_ArrayIDFunc<int>._0_8_;
      compute_tree_depth_order<flow_cutter::ComputeSeparator>
                (&local_338,&local_248,&local_260,(ComputeSeparator *)local_388,best_tree_depth + -1
                );
      test_new_elimination_order(&local_138,&local_338);
      if (local_338.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
        operator_delete__(local_338.super_ArrayIDFunc<int>.data_);
      }
      if (local_260.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
        operator_delete__(local_260.super_ArrayIDFunc<int>.data_);
      }
      if (local_248.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
        operator_delete__(local_248.super_ArrayIDFunc<int>.data_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_358._M_dataplus._M_p != &local_358.field_2) {
        operator_delete(local_358._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_448._M_dataplus._M_p != &local_448.field_2) {
        operator_delete(local_448._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
        operator_delete(local_4e0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498._M_dataplus._M_p != &local_498.field_2) {
        operator_delete(local_498._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
        operator_delete(local_3c8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_428._M_dataplus._M_p != &local_428.field_2) {
        operator_delete(local_428._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
        operator_delete(local_4c0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
        operator_delete(local_3e8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
        operator_delete(local_3a8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_408._M_dataplus._M_p != &local_408.field_2) {
        operator_delete(local_408._M_dataplus._M_p);
      }
      iVar3 = (int)uVar11;
      if ((int)(uVar11 / 3) * 3 + (int)local_360 != 0) {
        local_4a0 = (undefined1  [8])((ulong)((long)local_4a0 * 0xbc8f) % 0x7fffffff);
        local_478.head.super_ArrayIDFunc<int>._4_4_ = SUB84(local_4a0,0);
        local_478.head.super_ArrayIDFunc<int>.preimage_count_ = 3;
        local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"cutter_count","");
        flow_cutter::Config::get(&local_3a8,(Config *)&local_478,&local_408);
        std::operator+(&local_3e8,"flowcutter cutter_count=",&local_3a8);
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_3e8);
        local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
        psVar8 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_4c0.field_2._M_allocated_capacity = *psVar8;
          local_4c0.field_2._8_8_ = puVar7[3];
        }
        else {
          local_4c0.field_2._M_allocated_capacity = *psVar8;
          local_4c0._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_4c0._M_string_length = puVar7[1];
        *puVar7 = psVar8;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"pierce_rating","");
        flow_cutter::Config::get(&local_3c8,(Config *)&local_478,&local_428);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_4a0 + 8),&local_4c0,&local_3c8);
        puVar7 = (undefined8 *)std::__cxx11::string::append(local_4a0 + 8);
        local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
        psVar8 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_4e0.field_2._M_allocated_capacity = *psVar8;
          local_4e0.field_2._8_8_ = puVar7[3];
        }
        else {
          local_4e0.field_2._M_allocated_capacity = *psVar8;
          local_4e0._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_4e0._M_string_length = puVar7[1];
        *puVar7 = psVar8;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"random_seed","");
        flow_cutter::Config::get(&local_358,(Config *)&local_478,&local_448);
        std::operator+(&local_158,&local_4e0,&local_358);
        ArrayIDFunc<int>::ArrayIDFunc
                  (&local_278.super_ArrayIDFunc<int>,&tail.super_ArrayIDFunc<int>);
        local_278.image_count_ = tail.image_count_;
        ArrayIDFunc<int>::ArrayIDFunc
                  (&local_290.super_ArrayIDFunc<int>,&head.super_ArrayIDFunc<int>);
        local_290.image_count_ = head.image_count_;
        local_368 = (PierceRating)local_478.tail.super_ArrayIDFunc<int>.data_;
        local_388._0_8_ = local_478.head.super_ArrayIDFunc<int>._0_8_;
        local_388._8_8_ = local_478.head.super_ArrayIDFunc<int>.data_;
        aStack_378._M_allocated_capacity = local_478.head._16_8_;
        aStack_378._8_8_ = local_478.tail.super_ArrayIDFunc<int>._0_8_;
        compute_tree_depth_order<flow_cutter::ComputeSeparator>
                  (&local_338,&local_278,&local_290,(ComputeSeparator *)local_388,
                   best_tree_depth + -1);
        test_new_elimination_order(&local_158,&local_338);
        if (local_338.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
          operator_delete__(local_338.super_ArrayIDFunc<int>.data_);
        }
        if (local_290.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
          operator_delete__(local_290.super_ArrayIDFunc<int>.data_);
        }
        if (local_278.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
          operator_delete__(local_278.super_ArrayIDFunc<int>.data_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_358._M_dataplus._M_p != &local_358.field_2) {
          operator_delete(local_358._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_448._M_dataplus._M_p != &local_448.field_2) {
          operator_delete(local_448._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
          operator_delete(local_4e0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_498._M_dataplus._M_p != &local_498.field_2) {
          operator_delete(local_498._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
          operator_delete(local_3c8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_428._M_dataplus._M_p != &local_428.field_2) {
          operator_delete(local_428._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
          operator_delete(local_4c0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
          operator_delete(local_3e8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
          operator_delete(local_3a8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_408._M_dataplus._M_p != &local_408.field_2) {
          operator_delete(local_408._M_dataplus._M_p);
        }
      }
      if (0xf < (uint)(iVar3 + (int)(uVar11 / 0x14) * -0x14)) {
        local_4a0 = (undefined1  [8])((ulong)((long)local_4a0 * 0xbc8f) % 0x7fffffff);
        local_478.head.super_ArrayIDFunc<int>._4_4_ = SUB84(local_4a0,0);
        local_478.head.super_ArrayIDFunc<int>.preimage_count_ = 0x14;
        local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"cutter_count","");
        flow_cutter::Config::get(&local_3a8,(Config *)&local_478,&local_408);
        std::operator+(&local_3e8,"flowcutter cutter_count=",&local_3a8);
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_3e8);
        local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
        psVar8 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_4c0.field_2._M_allocated_capacity = *psVar8;
          local_4c0.field_2._8_8_ = puVar7[3];
        }
        else {
          local_4c0.field_2._M_allocated_capacity = *psVar8;
          local_4c0._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_4c0._M_string_length = puVar7[1];
        *puVar7 = psVar8;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"pierce_rating","");
        flow_cutter::Config::get(&local_3c8,(Config *)&local_478,&local_428);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_4a0 + 8),&local_4c0,&local_3c8);
        puVar7 = (undefined8 *)std::__cxx11::string::append(local_4a0 + 8);
        local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
        psVar8 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_4e0.field_2._M_allocated_capacity = *psVar8;
          local_4e0.field_2._8_8_ = puVar7[3];
        }
        else {
          local_4e0.field_2._M_allocated_capacity = *psVar8;
          local_4e0._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_4e0._M_string_length = puVar7[1];
        *puVar7 = psVar8;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"random_seed","");
        flow_cutter::Config::get(&local_358,(Config *)&local_478,&local_448);
        std::operator+(&local_178,&local_4e0,&local_358);
        ArrayIDFunc<int>::ArrayIDFunc
                  (&local_2a8.super_ArrayIDFunc<int>,&tail.super_ArrayIDFunc<int>);
        local_2a8.image_count_ = tail.image_count_;
        ArrayIDFunc<int>::ArrayIDFunc
                  (&local_2c0.super_ArrayIDFunc<int>,&head.super_ArrayIDFunc<int>);
        local_2c0.image_count_ = head.image_count_;
        local_368 = (PierceRating)local_478.tail.super_ArrayIDFunc<int>.data_;
        local_388._0_8_ = local_478.head.super_ArrayIDFunc<int>._0_8_;
        local_388._8_8_ = local_478.head.super_ArrayIDFunc<int>.data_;
        aStack_378._M_allocated_capacity = local_478.head._16_8_;
        aStack_378._8_8_ = local_478.tail.super_ArrayIDFunc<int>._0_8_;
        compute_tree_depth_order<flow_cutter::ComputeSeparator>
                  (&local_338,&local_2a8,&local_2c0,(ComputeSeparator *)local_388,
                   best_tree_depth + -1);
        test_new_elimination_order(&local_178,&local_338);
        if (local_338.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
          operator_delete__(local_338.super_ArrayIDFunc<int>.data_);
        }
        if (local_2c0.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
          operator_delete__(local_2c0.super_ArrayIDFunc<int>.data_);
        }
        if (local_2a8.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
          operator_delete__(local_2a8.super_ArrayIDFunc<int>.data_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_358._M_dataplus._M_p != &local_358.field_2) {
          operator_delete(local_358._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_448._M_dataplus._M_p != &local_448.field_2) {
          operator_delete(local_448._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
          operator_delete(local_4e0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_498._M_dataplus._M_p != &local_498.field_2) {
          operator_delete(local_498._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
          operator_delete(local_3c8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_428._M_dataplus._M_p != &local_428.field_2) {
          operator_delete(local_428._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
          operator_delete(local_4c0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
          operator_delete(local_3e8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
          operator_delete(local_3a8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_408._M_dataplus._M_p != &local_408.field_2) {
          operator_delete(local_408._M_dataplus._M_p);
        }
      }
      if (0x1e < (uint)(iVar3 + (int)(uVar11 / 0x32) * -0x32)) {
        local_4a0 = (undefined1  [8])((ulong)((long)local_4a0 * 0xbc8f) % 0x7fffffff);
        local_478.head.super_ArrayIDFunc<int>._4_4_ = SUB84(local_4a0,0);
        local_478.head.super_ArrayIDFunc<int>.preimage_count_ = 0x28;
        local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"cutter_count","");
        flow_cutter::Config::get(&local_3a8,(Config *)&local_478,&local_408);
        std::operator+(&local_3e8,"flowcutter cutter_count=",&local_3a8);
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_3e8);
        local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
        psVar8 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_4c0.field_2._M_allocated_capacity = *psVar8;
          local_4c0.field_2._8_8_ = puVar7[3];
        }
        else {
          local_4c0.field_2._M_allocated_capacity = *psVar8;
          local_4c0._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_4c0._M_string_length = puVar7[1];
        *puVar7 = psVar8;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"pierce_rating","");
        flow_cutter::Config::get(&local_3c8,(Config *)&local_478,&local_428);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_4a0 + 8),&local_4c0,&local_3c8);
        puVar7 = (undefined8 *)std::__cxx11::string::append(local_4a0 + 8);
        local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
        psVar8 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_4e0.field_2._M_allocated_capacity = *psVar8;
          local_4e0.field_2._8_8_ = puVar7[3];
        }
        else {
          local_4e0.field_2._M_allocated_capacity = *psVar8;
          local_4e0._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_4e0._M_string_length = puVar7[1];
        *puVar7 = psVar8;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"random_seed","");
        flow_cutter::Config::get(&local_358,(Config *)&local_478,&local_448);
        std::operator+(&local_198,&local_4e0,&local_358);
        ArrayIDFunc<int>::ArrayIDFunc
                  (&local_2d8.super_ArrayIDFunc<int>,&tail.super_ArrayIDFunc<int>);
        local_2d8.image_count_ = tail.image_count_;
        ArrayIDFunc<int>::ArrayIDFunc
                  (&local_2f0.super_ArrayIDFunc<int>,&head.super_ArrayIDFunc<int>);
        local_2f0.image_count_ = head.image_count_;
        local_368 = (PierceRating)local_478.tail.super_ArrayIDFunc<int>.data_;
        local_388._0_8_ = local_478.head.super_ArrayIDFunc<int>._0_8_;
        local_388._8_8_ = local_478.head.super_ArrayIDFunc<int>.data_;
        aStack_378._M_allocated_capacity = local_478.head._16_8_;
        aStack_378._8_8_ = local_478.tail.super_ArrayIDFunc<int>._0_8_;
        compute_tree_depth_order<flow_cutter::ComputeSeparator>
                  (&local_338,&local_2d8,&local_2f0,(ComputeSeparator *)local_388,
                   best_tree_depth + -1);
        test_new_elimination_order(&local_198,&local_338);
        if (local_338.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
          operator_delete__(local_338.super_ArrayIDFunc<int>.data_);
        }
        if (local_2f0.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
          operator_delete__(local_2f0.super_ArrayIDFunc<int>.data_);
        }
        if (local_2d8.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
          operator_delete__(local_2d8.super_ArrayIDFunc<int>.data_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_358._M_dataplus._M_p != &local_358.field_2) {
          operator_delete(local_358._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_448._M_dataplus._M_p != &local_448.field_2) {
          operator_delete(local_448._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
          operator_delete(local_4e0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_498._M_dataplus._M_p != &local_498.field_2) {
          operator_delete(local_498._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
          operator_delete(local_3c8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_428._M_dataplus._M_p != &local_428.field_2) {
          operator_delete(local_428._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
          operator_delete(local_4c0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
          operator_delete(local_3e8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
          operator_delete(local_3a8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_408._M_dataplus._M_p != &local_408.field_2) {
          operator_delete(local_408._M_dataplus._M_p);
        }
      }
      if (0x62 < (uint)(iVar3 + (int)(uVar11 / 100) * -100)) {
        local_4a0 = (undefined1  [8])((ulong)((long)local_4a0 * 0xbc8f) % 0x7fffffff);
        local_478.head.super_ArrayIDFunc<int>._4_4_ = SUB84(local_4a0,0);
        local_478.head.super_ArrayIDFunc<int>.preimage_count_ = 0x50;
        local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"cutter_count","");
        flow_cutter::Config::get(&local_3a8,(Config *)&local_478,&local_408);
        std::operator+(&local_3e8,"flowcutter cutter_count=",&local_3a8);
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_3e8);
        local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
        psVar8 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_4c0.field_2._M_allocated_capacity = *psVar8;
          local_4c0.field_2._8_8_ = puVar7[3];
        }
        else {
          local_4c0.field_2._M_allocated_capacity = *psVar8;
          local_4c0._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_4c0._M_string_length = puVar7[1];
        *puVar7 = psVar8;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"pierce_rating","");
        flow_cutter::Config::get(&local_3c8,(Config *)&local_478,&local_428);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_4a0 + 8),&local_4c0,&local_3c8);
        puVar7 = (undefined8 *)std::__cxx11::string::append(local_4a0 + 8);
        local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
        psVar8 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_4e0.field_2._M_allocated_capacity = *psVar8;
          local_4e0.field_2._8_8_ = puVar7[3];
        }
        else {
          local_4e0.field_2._M_allocated_capacity = *psVar8;
          local_4e0._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_4e0._M_string_length = puVar7[1];
        *puVar7 = psVar8;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"random_seed","");
        flow_cutter::Config::get(&local_358,(Config *)&local_478,&local_448);
        std::operator+(&local_1b8,&local_4e0,&local_358);
        ArrayIDFunc<int>::ArrayIDFunc
                  (&local_308.super_ArrayIDFunc<int>,&tail.super_ArrayIDFunc<int>);
        local_308.image_count_ = tail.image_count_;
        ArrayIDFunc<int>::ArrayIDFunc
                  (&local_320.super_ArrayIDFunc<int>,&head.super_ArrayIDFunc<int>);
        local_320.image_count_ = head.image_count_;
        local_368 = (PierceRating)local_478.tail.super_ArrayIDFunc<int>.data_;
        local_388._0_8_ = local_478.head.super_ArrayIDFunc<int>._0_8_;
        local_388._8_8_ = local_478.head.super_ArrayIDFunc<int>.data_;
        aStack_378._M_allocated_capacity = local_478.head._16_8_;
        aStack_378._8_8_ = local_478.tail.super_ArrayIDFunc<int>._0_8_;
        compute_tree_depth_order<flow_cutter::ComputeSeparator>
                  (&local_338,&local_308,&local_320,(ComputeSeparator *)local_388,
                   best_tree_depth + -1);
        test_new_elimination_order(&local_1b8,&local_338);
        if (local_338.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
          operator_delete__(local_338.super_ArrayIDFunc<int>.data_);
        }
        if (local_320.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
          operator_delete__(local_320.super_ArrayIDFunc<int>.data_);
        }
        if (local_308.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
          operator_delete__(local_308.super_ArrayIDFunc<int>.data_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_358._M_dataplus._M_p != &local_358.field_2) {
          operator_delete(local_358._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_448._M_dataplus._M_p != &local_448.field_2) {
          operator_delete(local_448._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
          operator_delete(local_4e0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_498._M_dataplus._M_p != &local_498.field_2) {
          operator_delete(local_498._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
          operator_delete(local_3c8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_428._M_dataplus._M_p != &local_428.field_2) {
          operator_delete(local_428._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
          operator_delete(local_4c0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
          operator_delete(local_3e8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
          operator_delete(local_3a8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_408._M_dataplus._M_p != &local_408.field_2) {
          operator_delete(local_408._M_dataplus._M_p);
        }
      }
      uVar11 = (ulong)(iVar3 + 1);
      local_360 = CONCAT44(local_360._4_4_,(int)local_360 + -1);
    } while( true );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._0_8_ != &aStack_378) {
    operator_delete((void *)local_388._0_8_);
  }
  return iVar3;
}

Assistant:

int main(int argc, char* argv[])
{
    signal(SIGTERM, signal_handler);
    signal(SIGINT, signal_handler);
    signal(SIGSEGV, signal_handler);

    int random_seed = 0;

    try {
        {
            string input_file_name = "-";
            for (int i = 1; i < argc; ++i) {
                if (!strcmp(argv[i], "--help") || !strcmp(argv[i], "-h")){
                    char msg[] = "Computes a tree depth decomposition given a graph. The graph is read by default from stdin in the PACE 2020 graph format. The output is written to stdout. Status messages can be written to stderr, if requested. By default, nothing is written to stderr. The program supports the following options:\n"
                    "  -h,--help Print this message and do nothing else\n"
                    "  --status  Print a message to stderr each time a\n"
                    "            better tree depth decomposition is found\n"
                    "  --verbose Print a message to stderr each time a tree\n"
                    "            depth decomposition was computed independent\n"
                    "            of whether it is better than the best one \n"
                    "            found so far\n"
                    "  -i <file> Instead of reading the graph from stdin,\n"
                    "            read it from <file>\n"
                    "  -s <seed> Use <seed> as seed for the random number\n"
                    "            generator. This must be an integer. The\n"
                    "            default seed is 0.\n";
                    ignore_return_value(write(STDERR_FILENO, msg, sizeof(msg)-1));
                    return 1;
                } else if (!strcmp(argv[i], "--verbose")) {
                    print_verbose_status = true;
                    print_status = true;
                } else if (!strcmp(argv[i], "--status")) {
                    print_status = true;
                } else if (!strcmp(argv[i], "-i") && i != argc - 1) {
                    ++i;
                    input_file_name = argv[i];
                } else if (!strcmp(argv[i], "-s") && i != argc - 1) {
                    ++i;
                    random_seed = atoi(argv[i]);
                }
            }

            auto g = uncached_load_pace_graph(input_file_name);
            tail = std::move(g.tail);
            head = std::move(g.head);
        }

        if (print_status) {
            string msg = "node_count = " + to_string(tail.image_count()) + " arc_count = " + to_string(tail.preimage_count()) + "\n";
            ignore_return_value(write(STDERR_FILENO, msg.data(), msg.length()));
        }

        if (print_status)
            program_start_milli_time = get_milli_time();

        const int node_count = tail.image_count();
                        
        #ifdef PARALLELIZE
        #pragma omp parallel
        #endif
        {
            try {
                std::minstd_rand rand_gen;
                rand_gen.seed(random_seed
                    #ifdef PARALLELIZE
                    + omp_get_thread_num()
                    #endif
                );

                #ifdef PARALLELIZE
                #pragma omp sections nowait
                #endif
                {
                    #ifdef PARALLELIZE
                    #pragma omp section
                    #endif
                    {
                        test_new_elimination_order("greedy order", compute_greedy_order(tail, head));

                        if(20*best_tree_depth > node_count)
                            test_new_elimination_order("refined bfs split in nested dissection", compute_tree_depth_order(
                                tail, head, 
                                [&](const ArrayIDIDFunc& tail, const ArrayIDIDFunc& head, int max_size) {
                                    return compute_separator_by_running_bfs(tail, head, max_size, rand_gen);
                                },
                                best_tree_depth - 1)
                            );
                    }

                    #ifdef PARALLELIZE
                    #pragma omp section
                    #endif
                    {
                        flow_cutter::Config config;
                        config.random_seed = rand_gen();
                        config.cutter_count = 0;
                        config.pierce_rating = flow_cutter::Config::PierceRating::max_target_minus_source_hop_dist;
                        config.max_cut_size = node_count;
                        test_new_elimination_order(
                            "edge flowcutter cutter_count=1 distant-source-target pierce_rating=max_target_minus_source_hop_dist random_seed=" + config.get("random_seed"),
                            compute_tree_depth_order(
                                tail, head,
                                flow_cutter::FastComputeSeparator(config),
                                best_tree_depth - 1));
                    }
                    #ifdef PARALLELIZE
                    #pragma omp section
                    #endif
                    { 
                        flow_cutter::Config config;
                        config.random_seed = rand_gen();
                        config.cutter_count = 0;
                        config.pierce_rating = flow_cutter::Config::PierceRating::max_target_minus_source_hop_dist;
                        config.max_cut_size = node_count;
                        test_new_elimination_order(
                            "flowcutter cutter_count=1 distant-source-target pierce_rating=max_target_minus_source_hop_dist random_seed=" + config.get("random_seed"),
                            compute_tree_depth_order(
                                tail, head,
                                flow_cutter::ComputeSeparator(config),
                                best_tree_depth - 1)
                        );
                    }
                }

                {
                    flow_cutter::Config config;
                    config.max_cut_size = node_count;

                    for (int i = 0;; ++i) {
                        
                        if (i % 2 == 0) {
                            config.pierce_rating = flow_cutter::Config::PierceRating::
                                max_target_minus_source_hop_dist;
                        } else {
                            config.pierce_rating = flow_cutter::Config::PierceRating::random;
                        }
                        
                        config.cutter_count = 1;
                        config.random_seed = rand_gen();
                        test_new_elimination_order(
                            "flowcutter"
                            " cutter_count="
                                + config.get("cutter_count") + " pierce_rating=" + config.get("pierce_rating") + " random_seed=" + config.get("random_seed"),
                            compute_tree_depth_order(
                                tail, head,
                                flow_cutter::ComputeSeparator(config),
                                best_tree_depth - 1));


                        config.cutter_count = 2;
                        config.random_seed = rand_gen();
                        test_new_elimination_order(
                            "flowcutter"
                            " cutter_count="
                                + config.get("cutter_count") + " pierce_rating=" + config.get("pierce_rating") + " random_seed=" + config.get("random_seed"),
                            compute_tree_depth_order(
                                tail, head,
                                flow_cutter::ComputeSeparator(config),
                                best_tree_depth - 1));

                        if((i%3)>0){
                                config.cutter_count = 3;
                                config.random_seed = rand_gen();
                                test_new_elimination_order(
                                    "flowcutter"
                                    " cutter_count="
                                        + config.get("cutter_count") + " pierce_rating=" + config.get("pierce_rating") + " random_seed=" + config.get("random_seed"),
                                    compute_tree_depth_order(
                                        tail, head,
                                        flow_cutter::ComputeSeparator(config),
                                        best_tree_depth - 1));
                        }

                        if((i%20)>15){
                                config.cutter_count = 20;
                                config.random_seed = rand_gen();
                                test_new_elimination_order(
                                    "flowcutter"
                                    " cutter_count="
                                        + config.get("cutter_count") + " pierce_rating=" + config.get("pierce_rating") + " random_seed=" + config.get("random_seed"),
                                    compute_tree_depth_order(
                                        tail, head,
                                        flow_cutter::ComputeSeparator(config),
                                        best_tree_depth - 1));
                        }

                        if((i%50)>30){
                                config.cutter_count = 40;
                                config.random_seed = rand_gen();
                                test_new_elimination_order(
                                    "flowcutter"
                                    " cutter_count="
                                        + config.get("cutter_count") + " pierce_rating=" + config.get("pierce_rating") + " random_seed=" + config.get("random_seed"),
                                    compute_tree_depth_order(
                                        tail, head,
                                        flow_cutter::ComputeSeparator(config),
                                        best_tree_depth - 1));
                        }

                        if((i%100)>98){
                                config.cutter_count = 80;
                                config.random_seed = rand_gen();
                                test_new_elimination_order(
                                    "flowcutter"
                                    " cutter_count="
                                        + config.get("cutter_count") + " pierce_rating=" + config.get("pierce_rating") + " random_seed=" + config.get("random_seed"),
                                    compute_tree_depth_order(
                                        tail, head,
                                        flow_cutter::ComputeSeparator(config),
                                        best_tree_depth - 1));
                        }
                    }
                }
            }
            catch (...)
            {
                signal_handler(0);
            }
        }
    }
    catch (...)
    {
        signal_handler(0);
    }
}